

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O2

void * icetUnsafeStateGet(IceTEnum pname,IceTEnum type)

{
  IceTState pIVar1;
  void *pvVar2;
  
  pIVar1 = icetGetState();
  if (pIVar1[pname].type == type) {
    pIVar1 = icetGetState();
    pvVar2 = pIVar1[pname].data;
  }
  else {
    icetRaiseDiagnostic("Mismatched types in unsafe state get.",0xffffffff,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/state.c"
                        ,0x268);
    pvVar2 = (void *)0x0;
  }
  return pvVar2;
}

Assistant:

static void *icetUnsafeStateGet(IceTEnum pname, IceTEnum type)
{
    stateCheck(pname, icetGetState());

    if (icetGetState()[pname].type != type) {
	icetRaiseError("Mismatched types in unsafe state get.",
		       ICET_SANITY_CHECK_FAIL);
	return NULL;
    }
    return icetGetState()[pname].data;
}